

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

int google::protobuf::GlobalReplaceSubstring(string *substring,string *replacement,string *s)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  string *in_RDX;
  int match_pos;
  int pos;
  int num_replacements;
  string tmp;
  LogMessage *in_stack_fffffffffffffef8;
  string *psVar2;
  LogMessage *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  LogMessage *in_stack_ffffffffffffff10;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff40;
  int local_9c;
  int local_98;
  int local_94;
  string local_90 [55];
  byte local_59;
  char local_58 [56];
  string *local_20;
  int local_4;
  
  local_59 = 0;
  local_20 = in_RDX;
  if (in_RDX == (string *)0x0) {
    in_stack_ffffffffffffff40._M_current = local_58;
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff10,
               (LogLevel_conflict)((ulong)in_stack_ffffffffffffff08 >> 0x20),
               (char *)in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    local_59 = 1;
    internal::LogMessage::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x3f8f99);
  }
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) == 0) && (uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) == 0)) {
    std::__cxx11::string::string(local_90);
    psVar2 = local_20;
    local_94 = 0;
    local_98 = 0;
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::data();
    __last._M_current = (char *)0x0;
    std::__cxx11::string::length();
    local_9c = std::__cxx11::string::find((char *)psVar2,(ulong)this,(ulong)__last._M_current);
    while (local_9c != -1) {
      local_94 = local_94 + 1;
      std::__cxx11::string::append(local_90,(ulong)local_20,(long)local_98);
      std::__cxx11::string::begin();
      std::__cxx11::string::end();
      std::__cxx11::string::
      append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                (this,in_stack_ffffffffffffff40,__last);
      local_98 = std::__cxx11::string::length();
      local_98 = local_9c + local_98;
      psVar2 = local_20;
      uVar1 = std::__cxx11::string::data();
      std::__cxx11::string::length();
      local_9c = std::__cxx11::string::find((char *)psVar2,uVar1,(long)local_98);
    }
    if (0 < local_94) {
      uVar1 = (ulong)local_98;
      psVar2 = local_20;
      std::__cxx11::string::length();
      std::__cxx11::string::append(local_90,(ulong)psVar2,uVar1);
      std::__cxx11::string::swap(local_20);
    }
    local_4 = local_94;
    std::__cxx11::string::~string(local_90);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int GlobalReplaceSubstring(const string& substring,
                           const string& replacement,
                           string* s) {
  GOOGLE_CHECK(s != nullptr);
  if (s->empty() || substring.empty())
    return 0;
  string tmp;
  int num_replacements = 0;
  int pos = 0;
  for (int match_pos = s->find(substring.data(), pos, substring.length());
       match_pos != string::npos;
       pos = match_pos + substring.length(),
           match_pos = s->find(substring.data(), pos, substring.length())) {
    ++num_replacements;
    // Append the original content before the match.
    tmp.append(*s, pos, match_pos - pos);
    // Append the replacement for the match.
    tmp.append(replacement.begin(), replacement.end());
  }
  // Append the content after the last match. If no replacements were made, the
  // original string is left untouched.
  if (num_replacements > 0) {
    tmp.append(*s, pos, s->length() - pos);
    s->swap(tmp);
  }
  return num_replacements;
}